

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STValidation.cpp
# Opt level: O0

Blob * __thiscall
jbcoin::STValidation::getSerialized(Blob *__return_storage_ptr__,STValidation *this)

{
  Blob *__x;
  undefined1 local_30 [8];
  Serializer s;
  STValidation *this_local;
  
  s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Serializer::Serializer((Serializer *)local_30,0x100);
  STObject::add(&this->super_STObject,(Serializer *)local_30);
  __x = Serializer::peekData((Serializer *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__,__x);
  Serializer::~Serializer((Serializer *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Blob STValidation::getSerialized () const
{
    Serializer s;
    add (s);
    return s.peekData ();
}